

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O3

bool P_TeleportMove(AActor *thing,DVector3 *pos,bool telefrag,bool modifyactor)

{
  sector_t *psVar1;
  double dVar2;
  bool bVar3;
  subsector_t *psVar4;
  AActor *pAVar5;
  bool bVar6;
  FPortalGroupArray grouplist;
  CheckResult cres2;
  CheckResult cres;
  FMultiBlockLinesIterator mit;
  FMultiBlockThingsIterator mit2;
  FName local_3a4;
  undefined1 local_3a0 [8];
  sector_t *local_398;
  sector_t_conflict *local_390;
  DObject *local_388;
  DAngle local_380;
  undefined1 local_378 [40];
  CheckResult local_350;
  undefined1 local_328 [72];
  Angle local_2e0;
  FTextureID local_2d8;
  sector_t *local_2d0;
  undefined2 local_2c8;
  bool local_2c5;
  TMap<AActor_*,_bool,_THashTraits<AActor_*>,_TValueTraits<bool>_> local_2b0;
  FRenderStyle local_298;
  ActorRenderFlags local_294;
  CheckResult local_290;
  FMultiBlockLinesIterator local_268;
  FMultiBlockThingsIterator local_1d0;
  
  local_2b0.NumUsed = 0;
  TMap<AActor_*,_bool,_THashTraits<AActor_*>,_TValueTraits<bool>_>::SetNodeVector(&local_2b0,1);
  local_298.field_0.BlendOp = false;
  local_294.Value = 0;
  local_2c5 = false;
  psVar1 = thing->Sector;
  local_328._24_8_ = pos->Z;
  local_328._8_8_ = pos->X;
  local_328._16_8_ = pos->Y;
  local_2c8._0_1_ = false;
  local_2c8._1_1_ = false;
  local_328._0_8_ = thing;
  P_GetFloorCeilingZ((FCheckPosition *)local_328,0);
  if (spechit.Count != 0) {
    spechit.Count = 0;
  }
  if ((((thing->flags2).Value & 0x40000) != 0) || ((level.flags._1_1_ & 4) != 0 || telefrag)) {
    bVar6 = ((thing->flags7).Value & 2) == 0;
  }
  else {
    bVar6 = false;
  }
  local_388 = (DObject *)(thing->__Pos).Z;
  (thing->__Pos).Z = pos->Z;
  psVar4 = P_PointInSubsector(pos->X,pos->Y);
  local_390 = psVar4->sector;
  local_378._24_8_ = (AActor **)0x0;
  local_378._32_8_ = 0.0;
  local_378._4_4_ = 1;
  local_378[0x10] = '\0';
  local_378[0] = false;
  local_398 = psVar1;
  FMultiBlockLinesIterator::FMultiBlockLinesIterator
            (&local_268,(FPortalGroupArray *)local_378,pos->X,pos->Y,pos->Z,thing->Height,
             thing->radius,(sector_t *)local_390);
  while (bVar3 = FMultiBlockLinesIterator::Next(&local_268,&local_290), bVar3) {
    PIT_FindFloorCeiling(&local_268,&local_290,&local_268.bbox,(FCheckPosition *)local_328,0);
  }
  (thing->__Pos).Z = (double)local_388;
  if (local_2c8._0_1_ == true) {
    local_328._56_8_ = local_328._40_8_;
  }
  FMultiBlockThingsIterator::FMultiBlockThingsIterator
            (&local_1d0,(FPortalGroupArray *)local_378,pos->X,pos->Y,pos->Z,thing->Height,
             thing->radius,false,(sector_t *)local_390);
LAB_00409f56:
  bVar3 = FMultiBlockThingsIterator::Next(&local_1d0,&local_350);
  pAVar5 = local_350.thing;
  if (bVar3) {
    if ((((local_350.thing != thing) && ((((local_350.thing)->flags).Value & 4) != 0)) &&
        (dVar2 = (local_350.thing)->radius + *(double *)(local_328._0_8_ + 0x178),
        ABS(((local_350.thing)->__Pos).X - local_350.Position.X) < dVar2)) &&
       ((ABS(((local_350.thing)->__Pos).Y - local_350.Position.Y) < dVar2 &&
        (((((local_350.thing)->flags2).Value | ((ActorFlags2 *)(local_328._0_8_ + 0x1c0))->Value) >>
          0x14 & 1) == 0)))) {
      if ((((ActorFlags6 *)(local_328._0_8_ + 0x1d0))->Value & 2) != 0) {
        AActor::GetSpecies((AActor *)(local_3a0 + 4));
        AActor::GetSpecies((AActor *)local_3a0);
        if (local_3a0._4_4_ == local_3a0._0_4_) goto LAB_00409f56;
      }
      if (((((thing->flags2).Value & 0x1000) != 0) || (((pAVar5->flags4).Value & 0x80) != 0)) &&
         ((((byte)i_compatflags & 0x10) == 0 &&
          ((((thing->flags3).Value & (pAVar5->flags3).Value) >> 8 & 1) == 0)))) {
        dVar2 = (pAVar5->__Pos).Z;
        if ((pAVar5->Height + dVar2 < pos->Z) || (pos->Z + thing->Height < dVar2))
        goto LAB_00409f56;
      }
      if (((!bVar6) || (((pAVar5->flags6).Value & 0x100) != 0)) &&
         (((pAVar5->flags7).Value & 4) == 0)) goto LAB_0040a1ff;
      if ((thing->player == (player_t *)0x0) || ((thing->player->cheats & 0x2000) == 0)) {
        local_3a4.Index = 0xc1;
        local_380.Degrees = 0.0;
        P_DamageMobj(pAVar5,thing,thing,1000000,&local_3a4,4,&local_380);
      }
    }
    goto LAB_00409f56;
  }
  if (!modifyactor) goto LAB_0040a1ff;
  AActor::SetOrigin(thing,pos->X,pos->Y,pos->Z,false);
  thing->floorz = (double)local_328._40_8_;
  thing->ceilingz = (double)local_328._48_8_;
  thing->floorsector = (sector_t *)local_2e0.Degrees;
  thing->floorpic = (FTextureID)local_328._64_4_;
  thing->floorterrain = local_328._68_4_;
  thing->ceilingsector = local_2d0;
  (thing->ceilingpic).texnum = local_2d8.texnum;
  thing->dropoffz = (double)local_328._56_8_;
  thing->BlockingLine = (line_t *)0x0;
  if (((thing->flags2).Value & 0x20) != 0) {
    AActor::AdjustFloorClip(thing);
  }
  pAVar5 = (AActor *)(&DAT_017e1fb8)[(long)consoleplayer * 0x54];
  if (pAVar5 == (AActor *)0x0) {
LAB_0040a1ca:
    pAVar5 = (AActor *)0x0;
  }
  else if (((pAVar5->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
    (&DAT_017e1fb8)[(long)consoleplayer * 0x54] = 0;
    goto LAB_0040a1ca;
  }
  if (pAVar5 == thing) {
    R_ResetViewInterpolation();
  }
  if ((i_compatflags2 & 0x20U) == 0 && ((thing->flags6).Value & 0x10000000) == 0) {
    AActor::CheckSectorTransition(thing,local_398);
  }
LAB_0040a1ff:
  TArray<FBlockThingsIterator::HashEntry,_FBlockThingsIterator::HashEntry>::~TArray
            (&local_1d0.blockIterator.DynHash);
  TArray<unsigned_short,_unsigned_short>::~TArray
            ((TArray<unsigned_short,_unsigned_short> *)(local_378 + 0x18));
  M_Free(local_2b0.Nodes);
  return !bVar3;
}

Assistant:

bool	P_TeleportMove(AActor* thing, const DVector3 &pos, bool telefrag, bool modifyactor) 
{
	FCheckPosition tmf;
	sector_t *oldsec = thing->Sector;

	// kill anything occupying the position


	// The base floor/ceiling is from the subsector that contains the point.
	// Any contacted lines the step closer together will adjust them.
	tmf.thing = thing;
	tmf.pos = pos;
	tmf.touchmidtex = false;
	tmf.abovemidtex = false;
	P_GetFloorCeilingZ(tmf, 0);

	spechit.Clear();	// this is needed so that no more specials get activated after crossing a teleporter.

	bool StompAlwaysFrags = ((thing->flags2 & MF2_TELESTOMP) || (level.flags & LEVEL_MONSTERSTELEFRAG) || telefrag) && !(thing->flags7 & MF7_NOTELESTOMP);

	// P_LineOpening requires the thing's z to be the destination z in order to work.
	double savedz = thing->Z();
	thing->SetZ(pos.Z);
	sector_t *sector = P_PointInSector(pos);

	FPortalGroupArray grouplist;
	FMultiBlockLinesIterator mit(grouplist, pos.X, pos.Y, pos.Z, thing->Height, thing->radius, sector);
	FMultiBlockLinesIterator::CheckResult cres;

	while (mit.Next(&cres))
	{
		PIT_FindFloorCeiling(mit, cres, mit.Box(), tmf, 0);
	}
	thing->SetZ(savedz);

	if (tmf.touchmidtex) tmf.dropoffz = tmf.floorz;

	FMultiBlockThingsIterator mit2(grouplist, pos.X, pos.Y, pos.Z, thing->Height, thing->radius, false, sector);
	FMultiBlockThingsIterator::CheckResult cres2;

	while (mit2.Next(&cres2))
	{
		AActor *th = cres2.thing;

		if (!(th->flags & MF_SHOOTABLE))
			continue;

		// don't clip against self
		if (th == thing)
			continue;

		double blockdist = th->radius + tmf.thing->radius;
		if (fabs(th->X() - cres2.Position.X) >= blockdist || fabs(th->Y() - cres2.Position.Y) >= blockdist)
			continue;

		if ((th->flags2 | tmf.thing->flags2) & MF2_THRUACTORS)
			continue;

		if (tmf.thing->flags6 & MF6_THRUSPECIES && tmf.thing->GetSpecies() == th->GetSpecies())
			continue;

		// [RH] Z-Check
		// But not if not MF2_PASSMOBJ or MF3_DONTOVERLAP are set!
		// Otherwise those things would get stuck inside each other.
		if ((thing->flags2 & MF2_PASSMOBJ || th->flags4 & MF4_ACTLIKEBRIDGE) && !(i_compatflags & COMPATF_NO_PASSMOBJ))
		{
			if (!(th->flags3 & thing->flags3 & MF3_DONTOVERLAP))
			{
				if (pos.Z > th->Top() ||	// overhead
					pos.Z + thing->Height < th->Z())	// underneath
					continue;
			}
		}

		// monsters don't stomp things except on boss level
		// [RH] Some Heretic/Hexen monsters can telestomp
		// ... and some items can never be telefragged while others will be telefragged by everything that teleports upon them.
		if ((StompAlwaysFrags && !(th->flags6 & MF6_NOTELEFRAG)) || (th->flags7 & MF7_ALWAYSTELEFRAG))
		{
			// Don't actually damage if predicting a teleport
			if (thing->player == NULL || !(thing->player->cheats & CF_PREDICTING))
				P_DamageMobj(th, thing, thing, TELEFRAG_DAMAGE, NAME_Telefrag, DMG_THRUSTLESS);
			continue;
		}
		return false;
	}

	if (modifyactor)
	{
		// the move is ok, so link the thing into its new position
		thing->SetOrigin(pos, false);
		thing->floorz = tmf.floorz;
		thing->ceilingz = tmf.ceilingz;
		thing->floorsector = tmf.floorsector;
		thing->floorpic = tmf.floorpic;
		thing->floorterrain = tmf.floorterrain;
		thing->ceilingsector = tmf.ceilingsector;
		thing->ceilingpic = tmf.ceilingpic;
		thing->dropoffz = tmf.dropoffz;        // killough 11/98
		thing->BlockingLine = NULL;

		if (thing->flags2 & MF2_FLOORCLIP)
		{
			thing->AdjustFloorClip();
		}

		if (thing == players[consoleplayer].camera)
		{
			R_ResetViewInterpolation();
		}

		// If this teleport was caused by a move, P_TryMove() will handle the
		// sector transition messages better than we can here.
		// This needs to be compatibility optioned because some older maps exploited this missing feature.
		if (!(thing->flags6 & MF6_INTRYMOVE) && !(i_compatflags2 & COMPATF2_TELEPORT))
		{
			thing->CheckSectorTransition(oldsec);
		}
	}

	return true;
}